

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O0

int rsa_sign_wrap(void *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,uchar *sig,
                 size_t *sig_len,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  mbedtls_rsa_context *rsa;
  size_t *sig_len_local;
  uchar *sig_local;
  size_t hash_len_local;
  uchar *hash_local;
  mbedtls_md_type_t md_alg_local;
  void *ctx_local;
  
  if ((md_alg == MBEDTLS_MD_NONE) && (0xffffffff < hash_len)) {
    ctx_local._4_4_ = -16000;
  }
  else {
    sVar1 = mbedtls_rsa_get_len((mbedtls_rsa_context *)ctx);
    *sig_len = sVar1;
    ctx_local._4_4_ =
         mbedtls_rsa_pkcs1_sign
                   ((mbedtls_rsa_context *)ctx,f_rng,p_rng,1,md_alg,(uint)hash_len,hash,sig);
  }
  return ctx_local._4_4_;
}

Assistant:

static int rsa_sign_wrap( void *ctx, mbedtls_md_type_t md_alg,
                   const unsigned char *hash, size_t hash_len,
                   unsigned char *sig, size_t *sig_len,
                   int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    mbedtls_rsa_context * rsa = (mbedtls_rsa_context *) ctx;

#if SIZE_MAX > UINT_MAX
    if( md_alg == MBEDTLS_MD_NONE && UINT_MAX < hash_len )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );
#endif /* SIZE_MAX > UINT_MAX */

    *sig_len = mbedtls_rsa_get_len( rsa );

    return( mbedtls_rsa_pkcs1_sign( rsa, f_rng, p_rng, MBEDTLS_RSA_PRIVATE,
                md_alg, (unsigned int) hash_len, hash, sig ) );
}